

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execSccEa<(moira::Instr)103,(moira::Mode)2,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  u32 data;
  u32 ea;
  u32 local_10;
  u32 local_c;
  
  bVar1 = readOp<(moira::Mode)2,(moira::Size)1,0ul>(this,opcode & 7,&local_c,&local_10);
  if (bVar1) {
    local_10 = 0xff;
    if ((this->reg).sr.z == false) {
      local_10 = 0;
    }
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    writeM<(moira::MemSpace)1,(moira::Size)1,4ul>(this,local_c,local_10);
  }
  return;
}

Assistant:

void
Moira::execSccEa(u16 opcode)
{
    int dst = ( _____________xxx(opcode) );
    u32 ea, data;

    if (!readOp<M,Byte>(dst, ea, data)) return;

    data = cond<I>() ? 0xFF : 0;
    prefetch();

    writeOp <M,Byte, POLLIPL> (dst, ea, data);
}